

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

xmlTextWriterPtr xmlNewTextWriterFilename(char *uri,int compression)

{
  xmlOutputBufferPtr out;
  xmlTextWriterPtr pxVar1;
  
  pxVar1 = (xmlTextWriterPtr)0x0;
  out = xmlOutputBufferCreateFilename(uri,(xmlCharEncodingHandlerPtr)0x0,compression);
  if (out == (xmlOutputBufferPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0x19,0x5ec,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"%s","xmlNewTextWriterFilename : cannot open uri\n");
  }
  else {
    pxVar1 = xmlNewTextWriter(out);
    if (pxVar1 == (xmlTextWriterPtr)0x0) {
      pxVar1 = (xmlTextWriterPtr)0x0;
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      (void *)0x0,0x19,2,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                      (char *)0x0,0,0,"%s","xmlNewTextWriterFilename : out of memory!\n");
      xmlOutputBufferClose(out);
    }
    else {
      pxVar1->indent = 0;
      pxVar1->doindent = 0;
    }
  }
  return pxVar1;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriterFilename(const char *uri, int compression)
{
    xmlTextWriterPtr ret;
    xmlOutputBufferPtr out;

    out = xmlOutputBufferCreateFilename(uri, NULL, compression);
    if (out == NULL) {
        xmlWriterErrMsg(NULL, XML_IO_EIO,
                        "xmlNewTextWriterFilename : cannot open uri\n");
        return NULL;
    }

    ret = xmlNewTextWriter(out);
    if (ret == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriterFilename : out of memory!\n");
        xmlOutputBufferClose(out);
        return NULL;
    }

    ret->indent = 0;
    ret->doindent = 0;
    return ret;
}